

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_31::PromiseOutputStream::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,PromiseOutputStream *this,
          AsyncInputStream *input,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  PromiseNode *pPVar2;
  EventLoop *this_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  undefined1 local_58 [8];
  PromiseNode *local_50;
  Own<kj::_::PromiseNode> local_48;
  Event *local_38;
  PromiseNode *local_30;
  
  if ((this->stream).ptr.ptr == (AsyncOutputStream *)0x0) {
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_58);
    this_00 = (EventLoop *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3552:39),_kj::_::PropagateException>
               ::anon_class_24_3_e7c12ea1_for_func::operator());
    ((PromiseNode *)&this_00->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00462138;
    this_00->depthFirstInsertPoint = (Event **)this;
    (this_00->daemons).disposer = (Disposer *)input;
    (this_00->daemons).ptr = (TaskSet *)amount;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::PromiseOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar2 = local_48.ptr;
    if ((EventLoop *)local_48.ptr != (EventLoop *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
    }
    pPVar2 = local_50;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_38;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = local_30;
    if (local_50 != (PromiseNode *)0x0) {
      local_50 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_58)
                (local_58,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    }
  }
  else {
    pAVar1 = (this->stream).ptr.ptr;
    (*pAVar1->_vptr_AsyncOutputStream[2])(__return_storage_ptr__,pAVar1,input,amount);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }